

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_probe_side_optimizer.cpp
# Opt level: O0

BuildSize duckdb::BuildProbeSideOptimizer::GetBuildSizes
                    (LogicalOperator *op,idx_t lhs_cardinality,idx_t rhs_cardinality)

{
  BuildSize BVar1;
  long in_RDI;
  BuildSize ret;
  idx_t in_stack_000000b8;
  vector<duckdb::LogicalType,_true> *in_stack_000000c0;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff78;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff80;
  vector<duckdb::LogicalType,_true> local_68 [3];
  long local_18;
  BuildSize local_10;
  
  local_18 = in_RDI;
  BuildSize::BuildSize(&local_10);
  if ((byte)(*(char *)(local_18 + 8) - 0x33U) < 4) {
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  *)in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_ffffffffffffff80);
    vector<duckdb::LogicalType,_true>::vector(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_10.left_side = GetBuildSize(in_stack_000000c0,in_stack_000000b8);
    vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xcf6cf1);
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  *)in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_ffffffffffffff80);
    vector<duckdb::LogicalType,_true>::vector(in_stack_ffffffffffffff80,local_68);
    local_10.right_side = GetBuildSize(in_stack_000000c0,in_stack_000000b8);
    vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xcf6d50);
  }
  BVar1.right_side = local_10.right_side;
  BVar1.left_side = local_10.left_side;
  return BVar1;
}

Assistant:

BuildSize BuildProbeSideOptimizer::GetBuildSizes(const LogicalOperator &op, const idx_t lhs_cardinality,
                                                 const idx_t rhs_cardinality) {
	BuildSize ret;
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
	case LogicalOperatorType::LOGICAL_CROSS_PRODUCT:
	case LogicalOperatorType::LOGICAL_ANY_JOIN:
	case LogicalOperatorType::LOGICAL_DELIM_JOIN: {
		ret.left_side = GetBuildSize(op.children[0]->types, lhs_cardinality);
		ret.right_side = GetBuildSize(op.children[1]->types, rhs_cardinality);
		return ret;
	}
	default:
		break;
	}
	return ret;
}